

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compress4X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  ulong srcSize_00;
  void *dst_00;
  
  if (srcSize < 0xc || dstSize < 0x11) {
    sVar3 = 0;
  }
  else {
    srcSize_00 = srcSize + 3 >> 2;
    dst_00 = (void *)((long)dst + 6);
    sVar2 = HUF_compress1X_usingCTable_internal(dst_00,dstSize - 6,src,srcSize_00,CTable,bmi2);
    if (sVar2 < 0xffffffffffffff89) {
      if (sVar2 == 0) {
        bVar1 = false;
        sVar2 = 0;
      }
      else {
        *(short *)dst = (short)sVar2;
        dst_00 = (void *)((long)dst_00 + sVar2);
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
    sVar3 = sVar2;
    if (bVar1) {
      sVar3 = HUF_compress1X_usingCTable_internal
                        (dst_00,(long)dst + (dstSize - (long)dst_00),
                         (void *)((long)src + srcSize_00),srcSize_00,CTable,bmi2);
      if (sVar3 < 0xffffffffffffff89) {
        if (sVar3 == 0) {
          bVar1 = false;
          sVar3 = 0;
        }
        else {
          *(short *)((long)dst + 2) = (short)sVar3;
          dst_00 = (void *)((long)dst_00 + sVar3);
          bVar1 = true;
          sVar3 = sVar2;
        }
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
        pvVar4 = (void *)((long)((long)src + srcSize_00) + srcSize_00);
        sVar2 = HUF_compress1X_usingCTable_internal
                          (dst_00,(long)dst + (dstSize - (long)dst_00),pvVar4,srcSize_00,CTable,bmi2
                          );
        if (sVar2 < 0xffffffffffffff89) {
          if (sVar2 == 0) {
            bVar1 = false;
            sVar3 = 0;
          }
          else {
            *(short *)((long)dst + 4) = (short)sVar2;
            dst_00 = (void *)((long)dst_00 + sVar2);
            bVar1 = true;
          }
        }
        else {
          bVar1 = false;
          sVar3 = sVar2;
        }
        if (bVar1) {
          pvVar4 = (void *)((long)pvVar4 + srcSize_00);
          sVar2 = HUF_compress1X_usingCTable_internal
                            (dst_00,(long)dst + (dstSize - (long)dst_00),pvVar4,
                             (long)src + (srcSize - (long)pvVar4),CTable,bmi2);
          if (sVar2 < 0xffffffffffffff89) {
            if (sVar2 == 0) {
              bVar1 = false;
              sVar3 = 0;
            }
            else {
              dst_00 = (void *)((long)dst_00 + sVar2);
              bVar1 = true;
            }
          }
          else {
            bVar1 = false;
            sVar3 = sVar2;
          }
          if (bVar1) {
            sVar3 = (long)dst_00 - (long)dst;
          }
        }
      }
    }
  }
  return sVar3;
}

Assistant:

static size_t
HUF_compress4X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, int bmi2)
{
    size_t const segmentSize = (srcSize+3)/4;   /* first 3 segments */
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    BYTE* const ostart = (BYTE*) dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    if (dstSize < 6 + 1 + 1 + 1 + 8) return 0;   /* minimum space to compress successfully */
    if (srcSize < 12) return 0;   /* no saving possible : too small input */
    op += 6;   /* jumpTable */

    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, oend-op, ip, segmentSize, CTable, bmi2) );
        if (cSize==0) return 0;
        assert(cSize <= 65535);
        MEM_writeLE16(ostart, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, oend-op, ip, segmentSize, CTable, bmi2) );
        if (cSize==0) return 0;
        assert(cSize <= 65535);
        MEM_writeLE16(ostart+2, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, oend-op, ip, segmentSize, CTable, bmi2) );
        if (cSize==0) return 0;
        assert(cSize <= 65535);
        MEM_writeLE16(ostart+4, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, oend-op, ip, iend-ip, CTable, bmi2) );
        if (cSize==0) return 0;
        op += cSize;
    }

    return op-ostart;
}